

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbd_standalone.cpp
# Opt level: O0

void __thiscall Intel_V4L2::getLRFrames(Intel_V4L2 *this,Mat *left_rect,Mat *right_rect)

{
  ushort uVar1;
  uchar *puVar2;
  int iVar3;
  ostream *this_00;
  uchar *puVar4;
  int local_38;
  int iStack_34;
  unsigned_short lr_pixel;
  int j;
  int i;
  unsigned_short *interlacedBuffer;
  int status;
  Mat *right_rect_local;
  Mat *left_rect_local;
  Intel_V4L2 *this_local;
  
  iVar3 = capture_frame(this);
  if (iVar3 == 0) {
    cv::Mat::create((int)left_rect,0x1e0,0x280);
    cv::Mat::create((int)right_rect,0x1e0,0x280);
    puVar2 = this->m_pBigBuffer;
    for (iStack_34 = 0; iStack_34 < 0x1e0; iStack_34 = iStack_34 + 1) {
      for (local_38 = 0; local_38 < 0x280; local_38 = local_38 + 1) {
        uVar1 = *(ushort *)(puVar2 + (long)(iStack_34 * 0x280 + local_38) * 2);
        puVar4 = cv::Mat::at<unsigned_char>(left_rect,iStack_34,local_38);
        *puVar4 = (uchar)((ulong)uVar1 % 0x100);
        puVar4 = cv::Mat::at<unsigned_char>(right_rect,iStack_34,local_38);
        *puVar4 = (uchar)((ulong)uVar1 / 0x100);
      }
    }
    CameraBase::incrementFrameCount(&this->super_CameraBase);
    CameraBase::saveFrame(&this->super_CameraBase,left_rect,right_rect);
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cout,"Error : failed to capture Infrared frame.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Intel_V4L2::getLRFrames (cv::Mat &left_rect, cv::Mat &right_rect) {
    int status = capture_frame ();
    if (0 != status) {
        std::cout << "Error : failed to capture Infrared frame." << std::endl;
        return;
    }
    left_rect.create  (480, 640, CV_8UC1);
    right_rect.create (480, 640, CV_8UC1);
    unsigned short *interlacedBuffer = (unsigned short *) m_pBigBuffer;
    for (int i = 0; i < 480; i++) {
        for (int j = 0; j < 640; j++) {
            unsigned short lr_pixel = interlacedBuffer[i*640+j];
            left_rect.at<unsigned char> (i, j)  = lr_pixel % 256;
            right_rect.at<unsigned char> (i, j) = lr_pixel / 256;
        }
    }
    incrementFrameCount ();
    saveFrame (left_rect, right_rect);
}